

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O0

int jpc_dec_tilefini(jpc_dec_t *dec,jpc_dec_tile_t *tile)

{
  jpc_dec_seg_t *seg_00;
  int local_64;
  long lStack_60;
  int cblkno;
  jpc_dec_cblk_t *cblk;
  jpc_dec_seg_t *seg;
  jpc_dec_prc_t *prc;
  jpc_dec_rlvl_t *pjStack_40;
  int prcno;
  jpc_dec_rlvl_t *rlvl;
  jpc_dec_band_t *band;
  int local_28;
  uint rlvlno;
  int bandno;
  int compno;
  jpc_dec_tcomp_t *tcomp;
  jpc_dec_tile_t *tile_local;
  jpc_dec_t *dec_local;
  
  if (tile->tcomps != (jpc_dec_tcomp_t *)0x0) {
    rlvlno = 0;
    _bandno = tile->tcomps;
    for (; (int)rlvlno < dec->numcomps; rlvlno = rlvlno + 1) {
      band._4_4_ = 0;
      pjStack_40 = _bandno->rlvls;
      for (; band._4_4_ < _bandno->numrlvls; band._4_4_ = band._4_4_ + 1) {
        if (pjStack_40->bands != (jpc_dec_band_t *)0x0) {
          local_28 = 0;
          rlvl = (jpc_dec_rlvl_t *)pjStack_40->bands;
          for (; local_28 < pjStack_40->numbands; local_28 = local_28 + 1) {
            if (*(long *)rlvl != 0) {
              prc._4_4_ = 0;
              seg = *(jpc_dec_seg_t **)rlvl;
              for (; prc._4_4_ < pjStack_40->numprcs; prc._4_4_ = prc._4_4_ + 1) {
                if (*(long *)&seg->lyrno != 0) {
                  local_64 = 0;
                  lStack_60 = *(long *)&seg->lyrno;
                  for (; local_64 < seg->cnt; local_64 = local_64 + 1) {
                    while (*(long *)(lStack_60 + 8) != 0) {
                      seg_00 = *(jpc_dec_seg_t **)(lStack_60 + 8);
                      jpc_seglist_remove((jpc_dec_seglist_t *)(lStack_60 + 8),seg_00);
                      jpc_seg_destroy(seg_00);
                    }
                    jas_matrix_destroy(*(jas_matrix_t **)(lStack_60 + 0x48));
                    if (*(long *)(lStack_60 + 0x30) != 0) {
                      jpc_mqdec_destroy(*(jpc_mqdec_t **)(lStack_60 + 0x30));
                    }
                    if (*(long *)(lStack_60 + 0x38) != 0) {
                      jpc_bitstream_close(*(jpc_bitstream_t **)(lStack_60 + 0x38));
                    }
                    if (*(long *)(lStack_60 + 0x40) != 0) {
                      jas_matrix_destroy(*(jas_matrix_t **)(lStack_60 + 0x40));
                    }
                    lStack_60 = lStack_60 + 0x50;
                  }
                  if (seg[1].next != (jpc_dec_seg_s *)0x0) {
                    jpc_tagtree_destroy((jpc_tagtree_t *)seg[1].next);
                  }
                  if (seg[1].prev != (jpc_dec_seg_s *)0x0) {
                    jpc_tagtree_destroy((jpc_tagtree_t *)seg[1].prev);
                  }
                  if (*(long *)&seg->lyrno != 0) {
                    jas_free(*(void **)&seg->lyrno);
                  }
                }
                seg = (jpc_dec_seg_t *)&seg[1].passno;
              }
            }
            if (rlvl->bands != (jpc_dec_band_t *)0x0) {
              jas_matrix_destroy((jas_matrix_t *)rlvl->bands);
            }
            if (*(long *)rlvl != 0) {
              jas_free(*(void **)rlvl);
            }
            rlvl = (jpc_dec_rlvl_t *)&rlvl->prcwidthexpn;
          }
          if (pjStack_40->bands != (jpc_dec_band_t *)0x0) {
            jas_free(pjStack_40->bands);
          }
        }
        pjStack_40 = pjStack_40 + 1;
      }
      if (_bandno->rlvls != (jpc_dec_rlvl_t *)0x0) {
        jas_free(_bandno->rlvls);
      }
      if (_bandno->data != (jas_matrix_t *)0x0) {
        jas_matrix_destroy(_bandno->data);
      }
      if (_bandno->tsfb != (jpc_tsfb_t *)0x0) {
        jpc_tsfb_destroy(_bandno->tsfb);
      }
      _bandno = _bandno + 1;
    }
  }
  if (tile->cp != (jpc_dec_cp_t *)0x0) {
    jpc_dec_cp_destroy(tile->cp);
  }
  if (tile->tcomps != (jpc_dec_tcomp_t *)0x0) {
    jas_free(tile->tcomps);
  }
  if (tile->pi != (jpc_pi_t *)0x0) {
    jpc_pi_destroy(tile->pi);
  }
  if (tile->pkthdrstream != (jas_stream_t *)0x0) {
    jas_stream_close(tile->pkthdrstream);
  }
  if (tile->pptstab != (jpc_ppxstab_t *)0x0) {
    jpc_ppxstab_destroy(tile->pptstab);
  }
  tile->state = 3;
  return 0;
}

Assistant:

static int jpc_dec_tilefini(jpc_dec_t *dec, jpc_dec_tile_t *tile)
{
	jpc_dec_tcomp_t *tcomp;
	int compno;
	int bandno;
	unsigned rlvlno;
	jpc_dec_band_t *band;
	jpc_dec_rlvl_t *rlvl;
	int prcno;
	jpc_dec_prc_t *prc;
	jpc_dec_seg_t *seg;
	jpc_dec_cblk_t *cblk;
	int cblkno;

	if (tile->tcomps) {

		for (compno = 0, tcomp = tile->tcomps; compno < dec->numcomps;
		  ++compno, ++tcomp) {
			for (rlvlno = 0, rlvl = tcomp->rlvls; rlvlno < tcomp->numrlvls;
			  ++rlvlno, ++rlvl) {
				if (!rlvl->bands) {
					continue;
				}
				for (bandno = 0, band = rlvl->bands; bandno < rlvl->numbands;
				  ++bandno, ++band) {
					if (band->prcs) {
						for (prcno = 0, prc = band->prcs; prcno <
						  rlvl->numprcs; ++prcno, ++prc) {
							if (!prc->cblks) {
								continue;
							}
							for (cblkno = 0, cblk = prc->cblks; cblkno <
							  prc->numcblks; ++cblkno, ++cblk) {

								while (cblk->segs.head) {
									seg = cblk->segs.head;
									jpc_seglist_remove(&cblk->segs, seg);
									jpc_seg_destroy(seg);
								}
								jas_matrix_destroy(cblk->data);
								if (cblk->mqdec) {
									jpc_mqdec_destroy(cblk->mqdec);
								}
								if (cblk->nulldec) {
									jpc_bitstream_close(cblk->nulldec);
								}
								if (cblk->flags) {
									jas_matrix_destroy(cblk->flags);
								}
							}
							if (prc->incltagtree) {
								jpc_tagtree_destroy(prc->incltagtree);
							}
							if (prc->numimsbstagtree) {
								jpc_tagtree_destroy(prc->numimsbstagtree);
							}
							if (prc->cblks) {
								jas_free(prc->cblks);
							}
						}
					}
					if (band->data) {
						jas_matrix_destroy(band->data);
					}
					if (band->prcs) {
						jas_free(band->prcs);
					}
				}
				if (rlvl->bands) {
					jas_free(rlvl->bands);
				}
			}
			if (tcomp->rlvls) {
				jas_free(tcomp->rlvls);
			}
			if (tcomp->data) {
				jas_matrix_destroy(tcomp->data);
			}
			if (tcomp->tsfb) {
				jpc_tsfb_destroy(tcomp->tsfb);
			}
		}
	}

	if (tile->cp) {
		jpc_dec_cp_destroy(tile->cp);
		//tile->cp = 0;
	}
	if (tile->tcomps) {
		jas_free(tile->tcomps);
		//tile->tcomps = 0;
	}
	if (tile->pi) {
		jpc_pi_destroy(tile->pi);
		//tile->pi = 0;
	}
	if (tile->pkthdrstream) {
		jas_stream_close(tile->pkthdrstream);
		//tile->pkthdrstream = 0;
	}
	if (tile->pptstab) {
		jpc_ppxstab_destroy(tile->pptstab);
		//tile->pptstab = 0;
	}

	tile->state = JPC_TILE_DONE;

	return 0;
}